

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  SectionTracker *pSVar3;
  ITrackerPtr childTracker;
  undefined1 local_49;
  SectionTracker *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  SectionTracker *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  ITracker *local_28;
  
  pIVar1 = ctx->m_currentTracker;
  (*pIVar1->_vptr_ITracker[0xc])(&local_38,pIVar1,nameAndLocation);
  if (local_38 == (SectionTracker *)0x0) {
    local_48 = (SectionTracker *)0x0;
    local_28 = pIVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Catch::TestCaseTracking::SectionTracker,std::allocator<Catch::TestCaseTracking::SectionTracker>,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              (&_Stack_40,&local_48,(allocator<Catch::TestCaseTracking::SectionTracker> *)&local_49,
               nameAndLocation,ctx,&local_28);
    this._M_pi = _Stack_40._M_pi;
    pSVar3 = local_48;
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_40._M_pi)->_M_use_count = (_Stack_40._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_40._M_pi)->_M_use_count = (_Stack_40._M_pi)->_M_use_count + 1;
      }
    }
    (*pIVar1->_vptr_ITracker[0xb])(pIVar1,&local_48);
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
  }
  else {
    iVar2 = (*(local_38->super_TrackerBase).super_ITracker._vptr_ITracker[0xe])();
    if ((char)iVar2 == '\0') {
      __assert_fail("childTracker->isSectionTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/test/3rdparty/Catch2/include/catch2/catch.hpp"
                    ,0x38be,
                    "static SectionTracker &Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext &, const NameAndLocation &)"
                   );
    }
    this._M_pi = local_30;
    pSVar3 = local_38;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_30->_M_use_count = local_30->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_30->_M_use_count = local_30->_M_use_count + 1;
      }
    }
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if ((ctx->m_runState != CompletedCycle) &&
     (iVar2 = (*(pSVar3->super_TrackerBase).super_ITracker._vptr_ITracker[2])(pSVar3),
     (char)iVar2 == '\0')) {
    (pSVar3->super_TrackerBase).m_runState = Executing;
    ((pSVar3->super_TrackerBase).m_ctx)->m_currentTracker = (ITracker *)pSVar3;
    pIVar1 = (pSVar3->super_TrackerBase).m_parent;
    if (pIVar1 != (ITracker *)0x0) {
      (*pIVar1->_vptr_ITracker[0xd])();
    }
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  return pSVar3;
}

Assistant:

SectionTracker& SectionTracker::acquire( TrackerContext& ctx, NameAndLocation const& nameAndLocation ) {
        std::shared_ptr<SectionTracker> section;

        ITracker& currentTracker = ctx.currentTracker();
        if( ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
            assert( childTracker );
            assert( childTracker->isSectionTracker() );
            section = std::static_pointer_cast<SectionTracker>( childTracker );
        }
        else {
            section = std::make_shared<SectionTracker>( nameAndLocation, ctx, &currentTracker );
            currentTracker.addChild( section );
        }
        if( !ctx.completedCycle() )
            section->tryOpen();
        return *section;
    }